

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nfa.cc
# Opt level: O1

int __thiscall re2::Prog::ComputeFirstByte(Prog *this)

{
  byte bVar1;
  uint uVar2;
  bool bVar3;
  ostream *poVar4;
  int iVar5;
  int *piVar6;
  Inst *pIVar7;
  uint uVar8;
  long lVar9;
  SparseSet q;
  uint local_1cc;
  SparseSet local_1c8;
  LogMessage local_1b0;
  
  SparseSet::SparseSet(&local_1c8,this->size_);
  iVar5 = this->start_;
  bVar3 = SparseSet::contains(&local_1c8,iVar5);
  if (!bVar3) {
    SparseSet::insert_new(&local_1c8,iVar5);
  }
  if (local_1c8.size_ != 0) {
    iVar5 = *local_1c8.dense_;
    lVar9 = (long)iVar5;
    pIVar7 = this->inst_;
    uVar8 = pIVar7[lVar9].out_opcode_;
    bVar3 = false;
    local_1cc = 0xffffffff;
    piVar6 = local_1c8.dense_;
    uVar2 = local_1cc;
    switch(uVar8 & 7) {
    case 0:
      goto switchD_0013f978_caseD_0;
    case 1:
      goto switchD_0013f978_caseD_1;
    case 2:
      goto switchD_0013f978_caseD_2;
    default:
      goto switchD_0013f978_caseD_3;
    case 5:
      goto switchD_0013f978_caseD_5;
    case 7:
      goto switchD_0013f978_caseD_7;
    }
  }
LAB_0013fb32:
  local_1cc = 0xffffffff;
LAB_0013fb3d:
  SparseSet::~SparseSet(&local_1c8);
  return local_1cc;
switchD_0013f978_caseD_0:
  LogMessage::LogMessage
            (&local_1b0,
             "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/nfa.cc",0x291,3);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0.str_,"unhandled ",10);
  poVar4 = (ostream *)
           std::ostream::operator<<((ostream *)&local_1b0.str_,pIVar7[lVar9].out_opcode_ & 7);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," in ComputeFirstByte",0x14);
  LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1b0);
  uVar2 = local_1cc;
switchD_0013f978_caseD_7:
  local_1cc = uVar2;
  bVar3 = true;
switchD_0013f978_caseD_5:
  if (!bVar3) goto LAB_0013fb32;
  piVar6 = piVar6 + 1;
  if (piVar6 == local_1c8.dense_ + local_1c8.size_) goto LAB_0013fb3d;
  iVar5 = *piVar6;
  lVar9 = (long)iVar5;
  pIVar7 = this->inst_;
  uVar8 = pIVar7[lVar9].out_opcode_;
  bVar3 = false;
  uVar2 = local_1cc;
  switch(uVar8 & 7) {
  case 0:
    goto switchD_0013f978_caseD_0;
  case 1:
    goto switchD_0013f978_caseD_1;
  case 2:
switchD_0013f978_caseD_2:
    if ((uVar8 & 8) == 0) {
      iVar5 = (int)lVar9 + 1;
      bVar3 = SparseSet::contains(&local_1c8,iVar5);
      if (!bVar3) {
        SparseSet::insert_new(&local_1c8,iVar5);
      }
    }
    if ((pIVar7[lVar9].out_opcode_ & 7) != 2) {
      __assert_fail("(opcode()) == (kInstByteRange)",
                    "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/prog.h",
                    0x6f,"int re2::Prog::Inst::lo()");
    }
    bVar1 = pIVar7[lVar9].field_1.field_3.lo_;
    bVar3 = false;
    if (((bVar1 == pIVar7[lVar9].field_1.field_3.hi_) &&
        ((0x19 < (byte)(bVar1 + 0x9f) ||
         (bVar3 = false, pIVar7[lVar9].field_1.field_3.foldcase_ == '\0')))) &&
       ((uVar2 = (uint)bVar1, local_1cc == 0xffffffff ||
        (bVar3 = false, uVar2 = local_1cc, local_1cc == bVar1)))) goto switchD_0013f978_caseD_7;
    goto switchD_0013f978_caseD_5;
  default:
    break;
  case 5:
    goto switchD_0013f978_caseD_5;
  case 7:
    goto switchD_0013f978_caseD_7;
  }
switchD_0013f978_caseD_3:
  if ((uVar8 & 8) == 0) {
    iVar5 = (int)lVar9 + 1;
    bVar3 = SparseSet::contains(&local_1c8,iVar5);
    if (!bVar3) {
      SparseSet::insert_new(&local_1c8,iVar5);
    }
  }
  uVar2 = local_1cc;
  if (pIVar7[lVar9].out_opcode_ < 0x10) goto switchD_0013f978_caseD_7;
  uVar8 = pIVar7[lVar9].out_opcode_ >> 4;
  bVar3 = SparseSet::contains(&local_1c8,uVar8);
  if (bVar3) goto switchD_0013f978_caseD_7;
LAB_0013fa46:
  SparseSet::insert_new(&local_1c8,uVar8);
  uVar2 = local_1cc;
  goto switchD_0013f978_caseD_7;
switchD_0013f978_caseD_1:
  if ((uVar8 & 8) != 0) {
    __assert_fail("!ip->last()",
                  "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/nfa.cc",
                  0x2b8,"int re2::Prog::ComputeFirstByte()");
  }
  uVar8 = iVar5 + 1;
  bVar3 = SparseSet::contains(&local_1c8,uVar8);
  uVar2 = local_1cc;
  if (bVar3) goto switchD_0013f978_caseD_7;
  goto LAB_0013fa46;
}

Assistant:

int Prog::ComputeFirstByte() {
  int b = -1;
  SparseSet q(size());
  q.insert(start());
  for (SparseSet::iterator it = q.begin(); it != q.end(); ++it) {
    int id = *it;
    Prog::Inst* ip = inst(id);
    switch (ip->opcode()) {
      default:
        LOG(DFATAL) << "unhandled " << ip->opcode() << " in ComputeFirstByte";
        break;

      case kInstMatch:
        // The empty string matches: no first byte.
        return -1;

      case kInstByteRange:
        if (!ip->last())
          q.insert(id+1);

        // Must match only a single byte
        if (ip->lo() != ip->hi())
          return -1;
        if (ip->foldcase() && 'a' <= ip->lo() && ip->lo() <= 'z')
          return -1;
        // If we haven't seen any bytes yet, record it;
        // otherwise must match the one we saw before.
        if (b == -1)
          b = ip->lo();
        else if (b != ip->lo())
          return -1;
        break;

      case kInstNop:
      case kInstCapture:
      case kInstEmptyWidth:
        if (!ip->last())
          q.insert(id+1);

        // Continue on.
        // Ignore ip->empty() flags for kInstEmptyWidth
        // in order to be as conservative as possible
        // (assume all possible empty-width flags are true).
        if (ip->out())
          q.insert(ip->out());
        break;

      case kInstAltMatch:
        DCHECK(!ip->last());
        q.insert(id+1);
        break;

      case kInstFail:
        break;
    }
  }
  return b;
}